

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O3

void F3DAudioCalculate(uint8_t *Instance,F3DAUDIO_LISTENER *pListener,F3DAUDIO_EMITTER *pEmitter,
                      uint32_t Flags,F3DAUDIO_DSP_SETTINGS *pDSPSettings)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint uVar14;
  float *pMatrixCoefficients;
  F3DAUDIO_DISTANCE_CURVE_POINT *pFVar15;
  F3DAUDIO_CONE *pFVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  F3DAUDIO_DISTANCE_CURVE *pFVar20;
  ulong uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  F3DAUDIO_VECTOR channelPosition;
  F3DAUDIO_VECTOR channelPosition_00;
  float local_12c;
  float local_118;
  ConfigInfo *local_110;
  F3DAUDIO_BASIS local_90;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar2 = (pListener->Position).x;
  uVar8 = (pListener->Position).y;
  uVar3 = (pEmitter->Position).x;
  uVar9 = (pEmitter->Position).y;
  fVar32 = (float)uVar2 - (float)uVar3;
  fVar35 = (float)uVar8 - (float)uVar9;
  fVar37 = (pListener->Position).z - (pEmitter->Position).z;
  fVar23 = (float)SDL_sqrtf(fVar37 * fVar37 + fVar32 * fVar32 + fVar35 * fVar35);
  pDSPSettings->EmitterToListenerDistance = fVar23;
  fVar39 = fVar23 / pEmitter->CurveDistanceScaler;
  if ((Flags & 1) != 0) {
    uVar22 = pDSPSettings->SrcChannelCount;
    uVar14 = pDSPSettings->DstChannelCount;
    pMatrixCoefficients = pDSPSettings->pMatrixCoefficients;
    local_110 = (ConfigInfo *)0x0;
    lVar18 = 0;
    do {
      if (*(int *)((long)&kSpeakersConfigInfo[0].configMask + lVar18) == *(int *)Instance) {
        local_110 = (ConfigInfo *)((long)&kSpeakersConfigInfo[0].configMask + lVar18);
        break;
      }
      lVar18 = lVar18 + 0x18;
    } while (lVar18 != 0xf0);
    pFVar20 = pEmitter->pVolumeCurve;
    if (pFVar20 == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      local_12c = 1.0;
      if (1.0 <= fVar39) {
        local_12c = 1.0 / fVar39;
      }
    }
    else {
      pFVar15 = pFVar20->pPoints;
      uVar21 = (ulong)pFVar20->PointCount;
      uVar19 = 1;
      if (uVar21 < 2) {
LAB_00108ed5:
        if (uVar19 != uVar21) {
          fVar34 = (pFVar15[uVar19].Distance - fVar39) /
                   (pFVar15[uVar19].Distance - pFVar15[uVar19 - 1].Distance);
          local_12c = (1.0 - fVar34) * pFVar15[uVar19].DSPSetting +
                      fVar34 * pFVar15[uVar19 - 1].DSPSetting;
          goto LAB_00108f31;
        }
      }
      else {
        do {
          if (fVar39 < pFVar15[uVar19].Distance) goto LAB_00108ed5;
          uVar19 = uVar19 + 1;
        } while (uVar21 != uVar19);
      }
      local_12c = pFVar15[pFVar20->PointCount - 1].DSPSetting;
    }
LAB_00108f31:
    pFVar20 = pEmitter->pLFECurve;
    if (pFVar20 == (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      local_118 = 1.0;
      if (1.0 <= fVar39) {
        local_118 = 1.0 / fVar39;
      }
    }
    else {
      pFVar15 = pFVar20->pPoints;
      uVar21 = (ulong)pFVar20->PointCount;
      uVar19 = 1;
      if (uVar21 < 2) {
LAB_00108f61:
        if (uVar19 != uVar21) {
          fVar34 = (pFVar15[uVar19].Distance - fVar39) /
                   (pFVar15[uVar19].Distance - pFVar15[uVar19 - 1].Distance);
          local_118 = (1.0 - fVar34) * pFVar15[uVar19].DSPSetting +
                      fVar34 * pFVar15[uVar19 - 1].DSPSetting;
          goto LAB_00108fc9;
        }
      }
      else {
        do {
          if (fVar39 < pFVar15[uVar19].Distance) goto LAB_00108f61;
          uVar19 = uVar19 + 1;
        } while (uVar21 != uVar19);
      }
      local_118 = pFVar15[pFVar20->PointCount - 1].DSPSetting;
    }
LAB_00108fc9:
    if (pListener->pCone != (F3DAUDIO_CONE *)0x0) {
      fVar24 = (float)SDL_acosf(((pListener->OrientFront).z * fVar37 +
                                (pListener->OrientFront).x * fVar32 +
                                (pListener->OrientFront).y * fVar35) / fVar23);
      pFVar16 = pListener->pCone;
      fVar34 = pFVar16->InnerAngle;
      fVar38 = pFVar16->OuterAngle;
      fVar40 = pFVar16->InnerVolume;
      fVar1 = pFVar16->OuterVolume;
      if (((((fVar34 != 0.0) || (NAN(fVar34))) || (fVar38 != 0.0)) || (fVar33 = fVar1, NAN(fVar38)))
         && ((((fVar33 = fVar40, fVar34 != 6.2831855 || (NAN(fVar34))) ||
              ((fVar38 != 6.2831855 || (NAN(fVar38))))) && (1e-07 < fVar23)))) {
        fVar24 = -fVar24;
        fVar34 = fVar34 * 0.5;
        if ((fVar34 < fVar24) && (fVar33 = fVar1, fVar24 <= fVar38 * 0.5)) {
          fVar34 = (fVar24 - fVar34) / (fVar38 * 0.5 - fVar34);
          fVar33 = fVar1 * fVar34 + (1.0 - fVar34) * fVar40;
        }
      }
      local_12c = local_12c * fVar33;
      local_118 = local_118 * fVar33;
    }
    if ((pEmitter->pCone != (F3DAUDIO_CONE *)0x0) && (pEmitter->ChannelCount == 1)) {
      fVar24 = (float)SDL_acosf(((pEmitter->OrientFront).z * fVar37 +
                                (pEmitter->OrientFront).x * fVar32 +
                                (pEmitter->OrientFront).y * fVar35) / fVar23);
      pFVar16 = pEmitter->pCone;
      fVar34 = pFVar16->InnerAngle;
      fVar38 = pFVar16->OuterAngle;
      fVar40 = pFVar16->InnerVolume;
      fVar1 = pFVar16->OuterVolume;
      if (((fVar34 != 0.0) || (((NAN(fVar34) || (fVar38 != 0.0)) || (fVar33 = fVar1, NAN(fVar38)))))
         && (((((fVar33 = fVar40, fVar34 != 6.2831855 || (NAN(fVar34))) || (fVar38 != 6.2831855)) ||
              (NAN(fVar38))) &&
             (((1e-07 < fVar23 && (fVar34 = fVar34 * 0.5, fVar34 < fVar24)) &&
              (fVar33 = fVar1, fVar24 <= fVar38 * 0.5)))))) {
        fVar34 = (fVar24 - fVar34) / (fVar38 * 0.5 - fVar34);
        fVar33 = fVar1 * fVar34 + (1.0 - fVar34) * fVar40;
      }
      local_12c = local_12c * fVar33;
    }
    SDL_memset(pMatrixCoefficients,0,(ulong)uVar22 * (ulong)uVar14 * 4);
    if ((ulong)uVar14 == 1) {
      uVar22 = pEmitter->ChannelCount;
      if ((ulong)uVar22 != 0) {
        pfVar17 = pEmitter->pChannelAzimuths;
        uVar19 = 0;
        do {
          if (((pfVar17 == (float *)0x0) || (fVar34 = pfVar17[uVar19], fVar34 != 6.2831855)) ||
             (NAN(fVar34))) {
            pMatrixCoefficients[uVar19] = local_12c;
          }
          uVar19 = uVar19 + 1;
        } while (uVar22 != uVar19);
      }
    }
    else {
      local_90.front.z = (pListener->OrientFront).z;
      local_90.front.x = (pListener->OrientFront).x;
      local_90.front.y = (pListener->OrientFront).y;
      fVar34 = (pListener->OrientFront).x;
      fVar38 = (pListener->OrientTop).x;
      uVar4 = (pListener->OrientTop).y;
      uVar10 = (pListener->OrientTop).z;
      uVar5 = (pListener->OrientFront).y;
      uVar11 = (pListener->OrientFront).z;
      local_90.right.z = fVar38 * (float)uVar5 - fVar34 * (float)uVar4;
      local_90.right.y = fVar34 * (float)uVar10 - fVar38 * (float)uVar11;
      local_90.right.x = (float)uVar11 * (float)uVar4 - (float)uVar10 * (float)uVar5;
      local_90.top.z = (pListener->OrientTop).z;
      local_90.top.x = (pListener->OrientTop).x;
      local_90.top.y = (pListener->OrientTop).y;
      uVar22 = pEmitter->ChannelCount;
      if (uVar22 == 1) {
        channelPosition.z = -fVar37;
        uVar19 = CONCAT44(fVar35,fVar32) ^ 0x8000000080000000;
        channelPosition.x = (float)(int)uVar19;
        channelPosition.y = (float)(int)(uVar19 >> 0x20);
        ComputeEmitterChannelCoefficients
                  (local_110,&local_90,pEmitter->InnerRadius,channelPosition,local_12c,local_118,
                   Flags,0,1,pMatrixCoefficients);
      }
      else if (uVar22 != 0) {
        fVar34 = (pEmitter->OrientFront).x;
        fVar38 = (pEmitter->OrientTop).x;
        uVar6 = (pEmitter->OrientTop).y;
        uVar12 = (pEmitter->OrientTop).z;
        uVar7 = (pEmitter->OrientFront).y;
        uVar13 = (pEmitter->OrientFront).z;
        local_68 = (float)uVar13 * (float)uVar6 - (float)uVar12 * (float)uVar7;
        fStack_64 = fVar34 * (float)uVar12 - fVar38 * (float)uVar13;
        fStack_60 = (float)uVar13 * 0.0 - (float)uVar12 * 0.0;
        fStack_5c = (float)uVar13 * 0.0 - (float)uVar12 * 0.0;
        local_58 = ZEXT416((uint)(fVar38 * (float)uVar7 - fVar34 * (float)uVar6));
        uVar19 = 0;
        do {
          if ((pEmitter->pChannelAzimuths[uVar19] != 6.2831855) ||
             (NAN(pEmitter->pChannelAzimuths[uVar19]))) {
            local_48 = ZEXT416((uint)(pEmitter->OrientFront).x);
            fVar34 = pEmitter->ChannelRadius;
            fVar25 = (float)SDL_cosf();
            SDL_cosf();
            SDL_cosf();
            fVar38 = pEmitter->ChannelRadius;
            fVar26 = (float)SDL_sinf();
            SDL_sinf();
            SDL_sinf();
            SDL_cosf();
            fVar40 = (pEmitter->OrientFront).y;
            fVar1 = pEmitter->ChannelRadius;
            fVar34 = fVar34 * (float)local_48._0_4_;
            fVar27 = (float)SDL_cosf();
            SDL_cosf();
            SDL_sinf();
            fVar38 = fVar38 * local_68;
            fVar36 = pEmitter->ChannelRadius * fStack_64;
            fVar28 = (float)SDL_sinf();
            SDL_sinf();
            SDL_cosf();
            SDL_cosf();
            fVar24 = (pEmitter->OrientFront).z;
            fVar33 = pEmitter->ChannelRadius;
            fVar29 = (float)SDL_cosf();
            SDL_sinf();
            SDL_sinf();
            fVar30 = pEmitter->ChannelRadius * (float)local_58._0_4_;
            fVar31 = (float)SDL_sinf();
            channelPosition_00.x = (fVar26 * fVar38 + fVar25 * fVar34) - fVar32;
            channelPosition_00.y = (fVar28 * fVar36 + fVar27 * fVar1 * fVar40) - fVar35;
            channelPosition_00.z = (fVar30 * fVar31 + fVar24 * fVar33 * fVar29) - fVar37;
            ComputeEmitterChannelCoefficients
                      (local_110,&local_90,pEmitter->InnerRadius,channelPosition_00,local_12c,
                       local_118,Flags,(uint32_t)uVar19,pEmitter->ChannelCount,pMatrixCoefficients);
            uVar22 = pEmitter->ChannelCount;
          }
          else {
            pMatrixCoefficients[local_110->LFSpeakerIdx * uVar22 + (uint32_t)uVar19] = local_118;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 < uVar22);
      }
    }
  }
  if ((Flags & 4) != 0) {
    pFVar20 = &F3DAudioCalculate::lpfDirectDefault;
    if (pEmitter->pLPFDirectCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pFVar20 = pEmitter->pLPFDirectCurve;
    }
    pFVar15 = pFVar20->pPoints;
    uVar21 = (ulong)pFVar20->PointCount;
    uVar19 = 1;
    if (uVar21 < 2) {
LAB_001095a2:
      if (uVar19 == uVar21) goto LAB_001095a7;
      fVar34 = (pFVar15[uVar19].Distance - fVar39) /
               (pFVar15[uVar19].Distance - pFVar15[uVar19 - 1].Distance);
      fVar34 = (1.0 - fVar34) * pFVar15[uVar19].DSPSetting + fVar34 * pFVar15[uVar19 - 1].DSPSetting
      ;
    }
    else {
      do {
        if (fVar39 < pFVar15[uVar19].Distance) goto LAB_001095a2;
        uVar19 = uVar19 + 1;
      } while (uVar21 != uVar19);
LAB_001095a7:
      fVar34 = pFVar15[pFVar20->PointCount - 1].DSPSetting;
    }
    pDSPSettings->LPFDirectCoefficient = fVar34;
  }
  if ((Flags & 8) != 0) {
    pFVar20 = &F3DAudioCalculate::lpfReverbDefault;
    if (pEmitter->pLPFReverbCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
      pFVar20 = pEmitter->pLPFReverbCurve;
    }
    pFVar15 = pFVar20->pPoints;
    uVar21 = (ulong)pFVar20->PointCount;
    uVar19 = 1;
    if (uVar21 < 2) {
LAB_00109621:
      if (uVar19 == uVar21) goto LAB_00109626;
      fVar34 = (pFVar15[uVar19].Distance - fVar39) /
               (pFVar15[uVar19].Distance - pFVar15[uVar19 - 1].Distance);
      fVar34 = (1.0 - fVar34) * pFVar15[uVar19].DSPSetting + fVar34 * pFVar15[uVar19 - 1].DSPSetting
      ;
    }
    else {
      do {
        if (fVar39 < pFVar15[uVar19].Distance) goto LAB_00109621;
        uVar19 = uVar19 + 1;
      } while (uVar21 != uVar19);
LAB_00109626:
      fVar34 = pFVar15[pFVar20->PointCount - 1].DSPSetting;
    }
    pDSPSettings->LPFReverbCoefficient = fVar34;
  }
  if ((Flags & 0x10) == 0) goto LAB_001096e6;
  pFVar20 = &F3DAudioCalculate::reverbDefault;
  if (pEmitter->pReverbCurve != (F3DAUDIO_DISTANCE_CURVE *)0x0) {
    pFVar20 = pEmitter->pReverbCurve;
  }
  pFVar15 = pFVar20->pPoints;
  uVar21 = (ulong)pFVar20->PointCount;
  uVar19 = 1;
  if (uVar21 < 2) {
LAB_001096a0:
    if (uVar19 == uVar21) goto LAB_001096a5;
    fVar39 = (pFVar15[uVar19].Distance - fVar39) /
             (pFVar15[uVar19].Distance - pFVar15[uVar19 - 1].Distance);
    fVar39 = (1.0 - fVar39) * pFVar15[uVar19].DSPSetting + fVar39 * pFVar15[uVar19 - 1].DSPSetting;
  }
  else {
    do {
      if (fVar39 < pFVar15[uVar19].Distance) goto LAB_001096a0;
      uVar19 = uVar19 + 1;
    } while (uVar21 != uVar19);
LAB_001096a5:
    fVar39 = pFVar15[pFVar20->PointCount - 1].DSPSetting;
  }
  pDSPSettings->ReverbLevel = fVar39;
LAB_001096e6:
  if ((Flags & 0x20) != 0) {
    fVar39 = *(float *)(Instance + 0xc);
    pDSPSettings->DopplerFactor = 1.0;
    fVar34 = 0.0;
    if ((fVar23 != 0.0) || (NAN(fVar23))) {
      fVar34 = ((pListener->Velocity).z * fVar37 +
               (pListener->Velocity).x * fVar32 + (pListener->Velocity).y * fVar35) / fVar23;
      pDSPSettings->ListenerVelocityComponent = fVar34;
      fVar38 = ((pEmitter->Velocity).z * fVar37 +
               (pEmitter->Velocity).x * fVar32 + (pEmitter->Velocity).y * fVar35) / fVar23;
    }
    else {
      pDSPSettings->ListenerVelocityComponent = 0.0;
      fVar38 = 0.0;
    }
    pDSPSettings->EmitterVelocityComponent = fVar38;
    if (0.0 < pEmitter->DopplerScaler) {
      fVar40 = fVar39 / pEmitter->DopplerScaler;
      if (fVar40 <= fVar34) {
        fVar34 = fVar40;
      }
      pDSPSettings->ListenerVelocityComponent = fVar34;
      if (fVar40 <= fVar38) {
        fVar38 = fVar40;
      }
      pDSPSettings->EmitterVelocityComponent = fVar38;
      fVar39 = (fVar39 - fVar34 * pEmitter->DopplerScaler) /
               (fVar39 - fVar38 * pEmitter->DopplerScaler);
      uVar22 = -(uint)NAN(fVar39);
      fVar34 = (float)(uVar22 & 0x3f800000 | ~uVar22 & (uint)fVar39);
      fVar39 = 4.0;
      if ((fVar34 <= 4.0) && (fVar39 = 0.5, 0.5 <= fVar34)) {
        fVar39 = fVar34;
      }
      pDSPSettings->DopplerFactor = fVar39;
    }
  }
  if ((Flags & 0x40) != 0) {
    if (1.2e-07 <= fVar23) {
      fVar23 = (float)SDL_acosf((fVar37 * (pEmitter->OrientFront).z +
                                (pEmitter->OrientFront).x * fVar32 +
                                (pEmitter->OrientFront).y * fVar35) / fVar23);
    }
    else {
      fVar23 = 1.5707964;
    }
    pDSPSettings->EmitterToListenerAngle = fVar23;
  }
  if ((((Flags & 2) != 0) && (*(int *)Instance == 3)) && ((ulong)pDSPSettings->DstChannelCount != 0)
     ) {
    memset(pDSPSettings->pDelayTimes,0,(ulong)pDSPSettings->DstChannelCount << 2);
    return;
  }
  return;
}

Assistant:

void F3DAudioCalculate(
	const F3DAUDIO_HANDLE Instance,
	const F3DAUDIO_LISTENER *pListener,
	const F3DAUDIO_EMITTER *pEmitter,
	uint32_t Flags,
	F3DAUDIO_DSP_SETTINGS *pDSPSettings
) {
	uint32_t i;
	F3DAUDIO_VECTOR emitterToListener;
	float eToLDistance, normalizedDistance, dp;

	#define DEFAULT_POINTS(name, x1, y1, x2, y2) \
		static F3DAUDIO_DISTANCE_CURVE_POINT name##Points[2] = \
		{ \
			{ x1, y1 }, \
			{ x2, y2 } \
		}; \
		static F3DAUDIO_DISTANCE_CURVE name##Default = \
		{ \
			(F3DAUDIO_DISTANCE_CURVE_POINT*) &name##Points[0], 2 \
		};
	DEFAULT_POINTS(lpfDirect, 0.0f, 1.0f, 1.0f, 0.75f)
	DEFAULT_POINTS(lpfReverb, 0.0f, 0.75f, 1.0f, 0.75f)
	DEFAULT_POINTS(reverb, 0.0f, 1.0f, 1.0f, 0.0f)
	#undef DEFAULT_POINTS

	/* For XACT, this calculates "Distance" */
	emitterToListener = VectorSub(pListener->Position, pEmitter->Position);
	eToLDistance = VectorLength(emitterToListener);
	pDSPSettings->EmitterToListenerDistance = eToLDistance;

	F3DAudioCheckCalculateParams(Instance, pListener, pEmitter, Flags, pDSPSettings);

	/* This is used by MATRIX, LPF, and REVERB */
	normalizedDistance = eToLDistance / pEmitter->CurveDistanceScaler;

	if (Flags & F3DAUDIO_CALCULATE_MATRIX)
	{
		CalculateMatrix(
			SPEAKERMASK(Instance),
			Flags,
			pListener,
			pEmitter,
			pDSPSettings->SrcChannelCount,
			pDSPSettings->DstChannelCount,
			emitterToListener,
			eToLDistance,
			normalizedDistance,
			pDSPSettings->pMatrixCoefficients
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_LPF_DIRECT)
	{
		pDSPSettings->LPFDirectCoefficient = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pLPFDirectCurve != NULL) ?
				pEmitter->pLPFDirectCurve :
				&lpfDirectDefault
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_LPF_REVERB)
	{
		pDSPSettings->LPFReverbCoefficient = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pLPFReverbCurve != NULL) ?
				pEmitter->pLPFReverbCurve :
				&lpfReverbDefault
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_REVERB)
	{
		pDSPSettings->ReverbLevel = ComputeDistanceAttenuation(
			normalizedDistance,
			(pEmitter->pReverbCurve != NULL) ?
				pEmitter->pReverbCurve :
				&reverbDefault
		);
	}

	/* For XACT, this calculates "DopplerPitchScalar" */
	if (Flags & F3DAUDIO_CALCULATE_DOPPLER)
	{
		CalculateDoppler(
			SPEEDOFSOUND(Instance),
			pListener,
			pEmitter,
			emitterToListener,
			eToLDistance,
			&pDSPSettings->ListenerVelocityComponent,
			&pDSPSettings->EmitterVelocityComponent,
			&pDSPSettings->DopplerFactor
		);
	}

	/* For XACT, this calculates "OrientationAngle" */
	if (Flags & F3DAUDIO_CALCULATE_EMITTER_ANGLE)
	{
		/* Determined roughly.
		 * Below that distance, the emitter angle is considered to be PI/2.
		 */
		#define EMITTER_ANGLE_NULL_DISTANCE 1.2e-7
		if (eToLDistance < EMITTER_ANGLE_NULL_DISTANCE)
		{
			pDSPSettings->EmitterToListenerAngle = F3DAUDIO_PI / 2.0f;
		}
		else
		{
			/* Note: pEmitter->OrientFront is normalized. */
			dp = VectorDot(emitterToListener, pEmitter->OrientFront) / eToLDistance;
			pDSPSettings->EmitterToListenerAngle = FAudio_acosf(dp);
		}
	}

	/* Unimplemented Flags */
	if (	(Flags & F3DAUDIO_CALCULATE_DELAY) &&
		SPEAKERMASK(Instance) == SPEAKER_STEREO	)
	{
		for (i = 0; i < pDSPSettings->DstChannelCount; i += 1)
		{
			pDSPSettings->pDelayTimes[i] = 0.0f;
		}
		FAudio_assert(0 && "DELAY not implemented!");
	}
}